

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::StrictEqualNumberType
               (Var aLeft,Var aRight,TypeId leftType,TypeId rightType,ScriptContext *requestContext)

{
  code *pcVar1;
  double dVar2;
  double dbl2;
  bool bVar3;
  BOOL BVar4;
  JavascriptTypedNumber<unsigned_long> *pJVar5;
  undefined4 *puVar6;
  JavascriptTypedNumber<long> *pJVar7;
  Type TVar8;
  undefined4 local_28;
  undefined4 uStack_24;
  
  switch(leftType) {
  case TypeIds_FirstNumberType:
    if (rightType != TypeIds_Number) {
      if (rightType != TypeIds_FirstNumberType) {
        return 0;
      }
      bVar3 = aLeft == aRight;
      goto LAB_00997194;
    }
    dVar2 = (double)(int)aLeft;
    break;
  case TypeIds_Number:
    switch(rightType) {
    case TypeIds_FirstNumberType:
      dVar2 = JavascriptNumber::GetValue(aLeft);
      local_28 = SUB84(dVar2,0);
      uStack_24 = (undefined4)((ulong)dVar2 >> 0x20);
      dbl2 = (double)(int)aRight;
      break;
    case TypeIds_Number:
      dVar2 = JavascriptNumber::GetValue(aLeft);
      goto LAB_00997210;
    case TypeIds_Int64Number:
      dVar2 = JavascriptNumber::GetValue(aLeft);
      pJVar7 = VarTo<Js::JavascriptTypedNumber<long>>(aRight);
      local_28 = SUB84(dVar2,0);
      uStack_24 = (undefined4)((ulong)dVar2 >> 0x20);
      dbl2 = (double)pJVar7->m_value;
      break;
    case TypeIds_LastNumberType:
      dVar2 = JavascriptNumber::GetValue(aLeft);
      pJVar5 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aRight);
      local_28 = SUB84(dVar2,0);
      uStack_24 = (undefined4)((ulong)dVar2 >> 0x20);
      dbl2 = ((double)CONCAT44(0x43300000,(int)pJVar5->m_value) - 4503599627370496.0) +
             ((double)CONCAT44(0x45300000,(int)(pJVar5->m_value >> 0x20)) - 1.9342813113834067e+25);
      break;
    default:
      goto switchD_009970f5_default;
    }
    goto LAB_00997225;
  case TypeIds_Int64Number:
    if (rightType != TypeIds_Number) {
      if (rightType == TypeIds_LastNumberType) {
        pJVar5 = (JavascriptTypedNumber<unsigned_long> *)
                 UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aLeft);
        goto LAB_0099717f;
      }
      if (rightType != TypeIds_Int64Number) {
        return 0;
      }
      pJVar5 = (JavascriptTypedNumber<unsigned_long> *)
               UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aLeft);
LAB_009970ce:
      TVar8 = pJVar5->m_value;
      pJVar5 = (JavascriptTypedNumber<unsigned_long> *)
               UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aRight);
LAB_0099718b:
      bVar3 = TVar8 == pJVar5->m_value;
LAB_00997194:
      return (uint)bVar3;
    }
    pJVar7 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aLeft);
    dVar2 = (double)pJVar7->m_value;
    break;
  case TypeIds_LastNumberType:
    if (rightType != TypeIds_Number) {
      if (rightType != TypeIds_LastNumberType) {
        if (rightType != TypeIds_Int64Number) {
          return 0;
        }
        pJVar5 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aLeft);
        goto LAB_009970ce;
      }
      pJVar5 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aLeft);
LAB_0099717f:
      TVar8 = pJVar5->m_value;
      pJVar5 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>(aRight);
      goto LAB_0099718b;
    }
    pJVar5 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aLeft);
    dVar2 = ((double)CONCAT44(0x43300000,(int)pJVar5->m_value) - 4503599627370496.0) +
            ((double)CONCAT44(0x45300000,(int)(pJVar5->m_value >> 0x20)) - 1.9342813113834067e+25);
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x39e,"(0 && \"Unreachable Code\")","0 && \"Unreachable Code\"");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
switchD_009970f5_default:
    return 0;
  }
LAB_00997210:
  dbl2 = JavascriptNumber::GetValue(aRight);
  local_28 = SUB84(dVar2,0);
  uStack_24 = (undefined4)((ulong)dVar2 >> 0x20);
LAB_00997225:
  BVar4 = FEqualDbl((double)CONCAT44(uStack_24,local_28),dbl2);
  return BVar4;
}

Assistant:

BOOL JavascriptOperators::StrictEqualNumberType(Var aLeft, Var aRight, TypeId leftType, TypeId rightType, ScriptContext *requestContext)
    {
        double dblLeft, dblRight;

        switch (leftType)
        {
        case TypeIds_Integer:
            switch (rightType)
            {
            case TypeIds_Integer:
                return aLeft == aRight;
                // we don't need to worry about int64: it cannot equal as we create
                // JavascriptInt64Number only in overflow scenarios.
            case TypeIds_Number:
                dblLeft = TaggedInt::ToDouble(aLeft);
                dblRight = JavascriptNumber::GetValue(aRight);
                goto CommonNumber;
            }
            return FALSE;

        case TypeIds_Int64Number:
            switch (rightType)
            {
            case TypeIds_Int64Number:
            {
                __int64 leftValue = UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                __int64 rightValue = UnsafeVarTo<JavascriptInt64Number>(aRight)->GetValue();
                return leftValue == rightValue;
            }
            case TypeIds_UInt64Number:
            {
                __int64 leftValue = UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                unsigned __int64 rightValue = VarTo<JavascriptUInt64Number>(aRight)->GetValue();
                return ((unsigned __int64)leftValue == rightValue);
            }
            case TypeIds_Number:
                dblLeft = (double)UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                dblRight = JavascriptNumber::GetValue(aRight);
                goto CommonNumber;
            }
            return FALSE;

        case TypeIds_UInt64Number:
            switch (rightType)
            {
            case TypeIds_Int64Number:
            {
                unsigned __int64 leftValue = UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                __int64 rightValue = UnsafeVarTo<JavascriptInt64Number>(aRight)->GetValue();
                return (leftValue == (unsigned __int64)rightValue);
            }
            case TypeIds_UInt64Number:
            {
                unsigned __int64 leftValue = UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                unsigned __int64 rightValue = VarTo<JavascriptUInt64Number>(aRight)->GetValue();
                return leftValue == rightValue;
            }
            case TypeIds_Number:
                dblLeft = (double)UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                dblRight = JavascriptNumber::GetValue(aRight);
                goto CommonNumber;
            }
            return FALSE;

        case TypeIds_Number:
            switch (rightType)
            {
            case TypeIds_Integer:
                dblLeft = JavascriptNumber::GetValue(aLeft);
                dblRight = TaggedInt::ToDouble(aRight);
                goto CommonNumber;
            case TypeIds_Int64Number:
                dblLeft = JavascriptNumber::GetValue(aLeft);
                dblRight = (double)VarTo<JavascriptInt64Number>(aRight)->GetValue();
                goto CommonNumber;
            case TypeIds_UInt64Number:
                dblLeft = JavascriptNumber::GetValue(aLeft);
                dblRight = (double)UnsafeVarTo<JavascriptUInt64Number>(aRight)->GetValue();
                goto CommonNumber;
            case TypeIds_Number:
                dblLeft = JavascriptNumber::GetValue(aLeft);
                dblRight = JavascriptNumber::GetValue(aRight);
            CommonNumber:
                return FEqualDbl(dblLeft, dblRight);
            }
            return FALSE;
        }

        Assert(0 && "Unreachable Code");
        return FALSE;
    }